

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O3

String * __thiscall
kj::anon_unknown_0::tryParse
          (String *__return_storage_ptr__,anon_unknown_0 *this,WaitScope *waitScope,Network *network
          ,StringPtr text,uint portHint)

{
  PromiseNode *pPVar1;
  long *plVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  String *pSVar4;
  Promise<kj::Own<kj::NetworkAddress>_> local_38;
  undefined8 *local_28;
  long *local_20;
  
  (*(code *)waitScope->loop->port)
            (&local_28,waitScope,network,text.content.ptr,text.content.size_ & 0xffffffff);
  Promise<kj::Own<kj::NetworkAddress>_>::wait(&local_38,&local_28);
  iVar3 = (*(local_38.super_PromiseBase.node.ptr)->_vptr_PromiseNode[4])(__return_storage_ptr__);
  pPVar1 = local_38.super_PromiseBase.node.ptr;
  pSVar4 = (String *)CONCAT44(extraout_var,iVar3);
  if (local_38.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    local_38.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    iVar3 = (**(local_38.super_PromiseBase.node.disposer)->_vptr_Disposer)
                      (local_38.super_PromiseBase.node.disposer,
                       pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
    pSVar4 = (String *)CONCAT44(extraout_var_00,iVar3);
  }
  plVar2 = local_20;
  if (local_20 != (long *)0x0) {
    local_20 = (long *)0x0;
    pSVar4 = (String *)(**(code **)*local_28)(local_28,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  return pSVar4;
}

Assistant:

String tryParse(WaitScope& waitScope, Network& network, StringPtr text, uint portHint = 0) {
  return network.parseAddress(text, portHint).wait(waitScope)->toString();
}